

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O1

void * dlsym_wrapper(void *handle,char *symbol_name)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  uint uVar4;
  link_map *plVar5;
  code *pcVar6;
  void *pvVar7;
  void **ppvVar8;
  long lVar9;
  undefined8 uVar10;
  link_map *lib;
  link_map *plVar11;
  internal_binding_t *binding;
  link_map *local_58;
  void *local_50;
  Addrs addrs;
  
  plVar5 = (link_map *)gotcha_get_wrappee(orig_dlopen_handle);
  pcVar6 = (code *)gotcha_get_wrappee(orig_dlsym_handle);
  __stream = _stderr;
  binding = (internal_binding_t *)0x0;
  if (0 < debug_level) {
    uVar3 = gotcha_gettid();
    uVar4 = getpid();
    fprintf(__stream,"[%d/%d][%s:%u] - User called dlsym(%p, %s)\n",(ulong)uVar3,(ulong)uVar4,
            "gotcha_dl.c",0xa0,handle,symbol_name);
  }
  iVar2 = lookup_hashtable(&function_hash_table,symbol_name,&binding);
  pvVar7 = (void *)(*pcVar6)(handle,symbol_name);
  if (iVar2 != -1) {
    ppvVar8 = getInternalBindingAddressPointer
                        ((internal_binding_t **)binding->user_binding->function_handle);
    if ((pvVar7 == (void *)0x0) || (*ppvVar8 == pvVar7)) {
      ppvVar8 = (void **)binding->user_binding->wrapper_pointer;
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    if (!bVar1) {
      return ppvVar8;
    }
  }
  if (handle == (void *)0xffffffffffffffff) {
    addrs.lmap = ___throw_regex_error;
    addrs.found = 0;
    addrs._20_4_ = 0;
    local_50 = (void *)0x0;
    local_58 = plVar5;
    dl_iterate_phdr(lib_header_callback,&addrs);
    if (addrs.found == 0) {
      if (debug_level != 0) {
        dlsym_wrapper_cold_3();
      }
      exit(0x7f);
    }
    lib = (addrs.lmap)->l_next;
    do {
      if (lib == (link_map *)0x0) {
        if (2 < debug_level) {
          dlsym_wrapper_cold_2();
        }
        plVar11 = (link_map *)0x0;
        break;
      }
      lVar9 = lookup_exported_symbol(symbol_name,lib,&local_50);
      plVar11 = lib;
      if (lVar9 == -1) {
        if (2 < debug_level) {
          dlsym_wrapper_cold_1();
        }
        lib = lib->l_next;
        plVar11 = plVar5;
      }
      plVar5 = plVar11;
    } while (lVar9 == -1);
    if (plVar11 == (link_map *)0x0) {
      pvVar7 = (void *)0x0;
    }
    else {
      uVar10 = (*(code *)local_58)(plVar11->l_name,2);
      pvVar7 = (void *)(*pcVar6)(uVar10,symbol_name);
    }
  }
  return pvVar7;
}

Assistant:

static void *dlsym_wrapper(void *handle, const char *symbol_name) {
  typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
  typeof(&dlsym_wrapper) orig_dlsym = gotcha_get_wrappee(orig_dlsym_handle);
  struct internal_binding_t *binding = NULL;
  debug_printf(1, "User called dlsym(%p, %s)\n", handle, symbol_name);
  int result = lookup_hashtable(&function_hash_table, (hash_key_t)symbol_name,
                                (hash_data_t *)&binding);
  void *val = orig_dlsym(handle, symbol_name);
  if (result != -1) {
    void **wrappee_ptr = getInternalBindingAddressPointer(
        (struct internal_binding_t **)binding->user_binding->function_handle);
    if (val == NULL || *wrappee_ptr == val) {
      // if the wrapper is found and the wrappee is the function requested.
      // This is needed in cases where we wrap a function F1 from library A and
      // we dynamically load function F1 from library B. As name is same, we
      // need to make sure the wrappee are the same as well
      return binding->user_binding->wrapper_pointer;
    }
  }
  if (handle == RTLD_NEXT) {
    struct link_map *lib = gotchas_dlsym_rtld_next_lookup(
        symbol_name, __builtin_return_address(0));
    if (lib) {
      void *handle = orig_dlopen(lib->l_name, RTLD_NOW);
      void *symbol = orig_dlsym(handle, symbol_name);
      return symbol;
    }
    return NULL;
  } else {
    return val;
  }
}